

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

OPJ_BOOL opj_pi_check_next_level
                   (OPJ_INT32 pos,opj_cp_t *cp,OPJ_UINT32 tileno,OPJ_UINT32 pino,OPJ_CHAR *prog)

{
  char cVar1;
  opj_tcp_t *poVar2;
  ulong uVar3;
  
  poVar2 = cp->tcps;
  do {
    if (pos < 0) {
      return 0;
    }
    for (uVar3 = (ulong)(uint)pos; cVar1 = prog[uVar3], cVar1 != 'C'; uVar3 = uVar3 - 1) {
      if (cVar1 == 'L') {
        if (poVar2[tileno].pocs[pino].lay_t != poVar2[tileno].pocs[pino].layE) {
          return 1;
        }
        goto LAB_00121667;
      }
      if (cVar1 == 'P') {
        if ((uint)poVar2[tileno].pocs[pino].prg < 2) {
          if (poVar2[tileno].pocs[pino].prc_t != poVar2[tileno].pocs[pino].prcE) {
            return 1;
          }
        }
        else {
          if (poVar2[tileno].pocs[pino].tx0_t != poVar2[tileno].pocs[pino].txE) {
            return 1;
          }
          if (poVar2[tileno].pocs[pino].ty0_t != poVar2[tileno].pocs[pino].tyE) {
            return 1;
          }
        }
        pos = (OPJ_INT32)uVar3;
        goto LAB_00121667;
      }
      if (cVar1 == 'R') {
        if (poVar2[tileno].pocs[pino].res_t != poVar2[tileno].pocs[pino].resE) {
          return 1;
        }
        goto LAB_00121667;
      }
    }
    if (poVar2[tileno].pocs[pino].comp_t != poVar2[tileno].pocs[pino].compE) {
      return 1;
    }
LAB_00121667:
    pos = pos - 1;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_pi_check_next_level(OPJ_INT32 pos,
                                        opj_cp_t *cp,
                                        OPJ_UINT32 tileno,
                                        OPJ_UINT32 pino,
                                        const OPJ_CHAR *prog)
{
    OPJ_INT32 i;
    opj_tcp_t *tcps = &cp->tcps[tileno];
    opj_poc_t *tcp = &tcps->pocs[pino];

    if (pos >= 0) {
        for (i = pos; pos >= 0; i--) {
            switch (prog[i]) {
            case 'R':
                if (tcp->res_t == tcp->resE) {
                    if (opj_pi_check_next_level(pos - 1, cp, tileno, pino, prog)) {
                        return OPJ_TRUE;
                    } else {
                        return OPJ_FALSE;
                    }
                } else {
                    return OPJ_TRUE;
                }
                break;
            case 'C':
                if (tcp->comp_t == tcp->compE) {
                    if (opj_pi_check_next_level(pos - 1, cp, tileno, pino, prog)) {
                        return OPJ_TRUE;
                    } else {
                        return OPJ_FALSE;
                    }
                } else {
                    return OPJ_TRUE;
                }
                break;
            case 'L':
                if (tcp->lay_t == tcp->layE) {
                    if (opj_pi_check_next_level(pos - 1, cp, tileno, pino, prog)) {
                        return OPJ_TRUE;
                    } else {
                        return OPJ_FALSE;
                    }
                } else {
                    return OPJ_TRUE;
                }
                break;
            case 'P':
                switch (tcp->prg) {
                case OPJ_LRCP: /* fall through */
                case OPJ_RLCP:
                    if (tcp->prc_t == tcp->prcE) {
                        if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                            return OPJ_TRUE;
                        } else {
                            return OPJ_FALSE;
                        }
                    } else {
                        return OPJ_TRUE;
                    }
                    break;
                default:
                    if (tcp->tx0_t == tcp->txE) {
                        /*TY*/
                        if (tcp->ty0_t == tcp->tyE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                return OPJ_TRUE;
                            } else {
                                return OPJ_FALSE;
                            }
                        } else {
                            return OPJ_TRUE;
                        }/*TY*/
                    } else {
                        return OPJ_TRUE;
                    }
                    break;
                }/*end case P*/
            }/*end switch*/
        }/*end for*/
    }/*end if*/
    return OPJ_FALSE;
}